

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall
Clasp::ShortImplicationsGraph::ImplicationList::move(ImplicationList *this,ImplicationList *other)

{
  __pointer_type pBVar1;
  left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U> *in_RDI;
  __pointer_type in_stack_ffffffffffffffd8;
  
  bk_lib::left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::move
            (in_RDI,(left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>
                     *)in_stack_ffffffffffffffd8);
  pBVar1 = std::atomic::operator_cast_to_Block_
                     ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)0x1cff80);
  if (pBVar1 != (__pointer_type)0x0) {
    operator_delete(pBVar1);
  }
  std::atomic::operator_cast_to_Block_((atomic<Clasp::ShortImplicationsGraph::Block_*> *)0x1cffa3);
  std::atomic<Clasp::ShortImplicationsGraph::Block_*>::operator=
            ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)in_RDI,in_stack_ffffffffffffffd8);
  std::atomic<Clasp::ShortImplicationsGraph::Block_*>::operator=
            ((atomic<Clasp::ShortImplicationsGraph::Block_*> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ShortImplicationsGraph::ImplicationList::move(ImplicationList& other) {
	ImpListBase::move(other);
	delete static_cast<Block*>(learnt);
	learnt = static_cast<Block*>(other.learnt);
	other.learnt = 0;
}